

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

ptr<log_entry> __thiscall nuraft::inmem_log_store::entry_at(inmem_log_store *this,ulong index)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar5;
  long lVar6;
  bool bVar7;
  ptr<log_entry> pVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(index + 0x38));
  if (iVar2 == 0) {
    lVar1 = *(long *)(index + 0x18);
    lVar6 = index + 0x10;
    lVar3 = lVar1;
    lVar5 = lVar6;
    if (lVar1 != 0) {
      do {
        bVar7 = *(ulong *)(lVar3 + 0x20) < in_RDX;
        if (!bVar7) {
          lVar5 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar7 * 8);
      } while (lVar3 != 0);
      if ((lVar5 == lVar6) || (in_RDX < *(ulong *)(lVar5 + 0x20))) {
        do {
          lVar3 = lVar1;
          lVar1 = *(long *)(lVar3 + 0x10);
        } while (*(long *)(lVar3 + 0x10) != 0);
        lVar5 = lVar6;
        if ((lVar3 != lVar6) && (*(long *)(lVar3 + 0x20) == 0)) {
          lVar5 = lVar3;
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar5 + 0x30));
    pthread_mutex_unlock((pthread_mutex_t *)(index + 0x38));
    pVar8 = make_clone((ptr<log_entry> *)this);
    _Var4 = pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
      _Var4._M_pi = extraout_RDX;
    }
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<log_entry>)pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ptr<log_entry> inmem_log_store::entry_at(ulong index) {
    ptr<log_entry> src = nullptr;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        src = entry->second;
    }
    return make_clone(src);
}